

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_input_is_mouse_click_down_in_rect(nk_input *i,nk_buttons id,nk_rect b,nk_bool down)

{
  nk_rect b_00;
  nk_bool nVar1;
  undefined4 in_EDX;
  uint in_ESI;
  long in_RDI;
  bool bVar2;
  undefined8 in_XMM0_Qa;
  nk_mouse_button *btn;
  long lVar3;
  undefined4 in_stack_ffffffffffffffe8;
  uint local_4;
  
  if (in_RDI == 0) {
    local_4 = 0;
  }
  else {
    lVar3 = in_RDI + 0x104 + (ulong)in_ESI * 0x10;
    b_00.y = (float)in_stack_ffffffffffffffe8;
    b_00.x = (float)(int)((ulong)in_RDI >> 0x20);
    b_00._8_8_ = in_XMM0_Qa;
    nVar1 = nk_input_has_mouse_click_down_in_rect
                      ((nk_input *)CONCAT44(in_ESI,in_EDX),(nk_buttons)((ulong)lVar3 >> 0x20),b_00,
                       (nk_bool)lVar3);
    bVar2 = false;
    if (nVar1 != 0) {
      bVar2 = *(int *)(lVar3 + 4) != 0;
    }
    local_4 = (uint)bVar2;
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_input_is_mouse_click_down_in_rect(const struct nk_input *i, enum nk_buttons id,
struct nk_rect b, nk_bool down)
{
const struct nk_mouse_button *btn;
if (!i) return nk_false;
btn = &i->mouse.buttons[id];
return (nk_input_has_mouse_click_down_in_rect(i, id, b, down) &&
btn->clicked) ? nk_true : nk_false;
}